

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::Solipsize(CFG::Block*,CFG::Branch::FlowType,CFG::
Shape*,wasm::InsertOrderedSet<CFG::Block_>__
          (void *this,Block *Target,FlowType Type,Shape *Ancestor,BlockSet *From)

{
  Branch *pBVar1;
  bool bVar2;
  Branch **ppBVar3;
  undefined4 in_register_00000014;
  _Self __tmp;
  undefined8 *puVar4;
  Block *local_40;
  Block *Target_local;
  Block *Prior;
  
  puVar4 = *(undefined8 **)((long)this + 0x90);
  local_40 = (Block *)this;
  while ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)puVar4 != &(local_40->BranchesIn).List
        ) {
    Target_local = (Block *)puVar4[2];
    bVar2 = contains<wasm::InsertOrderedSet<CFG::Block*>,CFG::Block*>
                      ((InsertOrderedSet<CFG::Block_*> *)Ancestor,&Target_local);
    if (bVar2) {
      ppBVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                          (&Target_local->BranchesOut,&local_40);
      pBVar1 = *ppBVar3;
      pBVar1->Ancestor = (Shape *)CONCAT44(in_register_00000014,Type);
      pBVar1->Type = (FlowType)Target;
      puVar4 = (undefined8 *)*puVar4;
      ::wasm::InsertOrderedSet<CFG::Block_*>::erase(&local_40->BranchesIn,&Target_local);
      ::wasm::InsertOrderedSet<CFG::Block_*>::insert(&local_40->ProcessedBranchesIn,&Target_local);
      ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::erase
                (&Target_local->BranchesOut,&local_40);
      ppBVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                          (&Target_local->ProcessedBranchesOut,&local_40);
      *ppBVar3 = pBVar1;
    }
    else {
      puVar4 = (undefined8 *)*puVar4;
    }
  }
  return;
}

Assistant:

void Solipsize(Block* Target,
                   Branch::FlowType Type,
                   Shape* Ancestor,
                   BlockSet& From) {
      PrintDebug("Solipsizing branches into %d\n", Target->Id);
      DebugDump(From, "  relevant to solipsize: ");
      for (auto iter = Target->BranchesIn.begin();
           iter != Target->BranchesIn.end();) {
        Block* Prior = *iter;
        if (!contains(From, Prior)) {
          iter++;
          continue;
        }
        Branch* PriorOut = Prior->BranchesOut[Target];
        PriorOut->Ancestor = Ancestor;
        PriorOut->Type = Type;
        iter++; // carefully increment iter before erasing
        Target->BranchesIn.erase(Prior);
        Target->ProcessedBranchesIn.insert(Prior);
        Prior->BranchesOut.erase(Target);
        Prior->ProcessedBranchesOut[Target] = PriorOut;
        PrintDebug("  eliminated branch from %d\n", Prior->Id);
      }
    }